

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WebServer.cpp
# Opt level: O0

void __thiscall WebServer::start(WebServer *this)

{
  EventLoop *this_00;
  pointer this_01;
  element_type *peVar1;
  LogStream *pLVar2;
  Logger local_10f8;
  allocator local_119;
  string local_118;
  allocator local_f1;
  string local_f0;
  allocator local_c9;
  string local_c8;
  allocator local_a1;
  string local_a0;
  shared_ptr<Channel> local_80 [2];
  WebServer *local_60;
  code *local_58;
  undefined8 local_50;
  type local_48;
  EventCallback local_30;
  WebServer *local_10;
  WebServer *this_local;
  
  local_10 = this;
  this_01 = std::unique_ptr<EventLoopThreadPool,_std::default_delete<EventLoopThreadPool>_>::
            operator->(&this->reactorPool_);
  EventLoopThreadPool::start(this_01);
  HttpConnPool::start(&this->connPool_);
  ignoreSigpipe();
  peVar1 = std::__shared_ptr_access<Channel,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<Channel,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      &this->acceptChannel_);
  local_58 = connectionCallback;
  local_50 = 0;
  local_60 = this;
  std::bind<void(WebServer::*)(),WebServer*>
            (&local_48,(offset_in_WebServer_to_subr *)&local_58,&local_60);
  std::function<void()>::function<std::_Bind<void(WebServer::*(WebServer*))()>,void>
            ((function<void()> *)&local_30,&local_48);
  Channel::setReadCallback(peVar1,&local_30);
  std::function<void_()>::~function(&local_30);
  peVar1 = std::__shared_ptr_access<Channel,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<Channel,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      &this->acceptChannel_);
  Channel::setEvent(peVar1,-0x7fffffff);
  this_00 = this->loop_;
  std::shared_ptr<Channel>::shared_ptr(local_80,&this->acceptChannel_);
  EventLoop::addChannel(this_00,local_80);
  std::shared_ptr<Channel>::~shared_ptr(local_80);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_a0,"/index.html",&local_a1);
  cachePage(this,&local_a0);
  std::__cxx11::string::~string((string *)&local_a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_a1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_c8,"/404.html",&local_c9);
  cachePage(this,&local_c8);
  std::__cxx11::string::~string((string *)&local_c8);
  std::allocator<char>::~allocator((allocator<char> *)&local_c9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_f0,"/400.html",&local_f1);
  cachePage(this,&local_f0);
  std::__cxx11::string::~string((string *)&local_f0);
  std::allocator<char>::~allocator((allocator<char> *)&local_f1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_118,"/403.html",&local_119);
  cachePage(this,&local_118);
  std::__cxx11::string::~string((string *)&local_118);
  std::allocator<char>::~allocator((allocator<char> *)&local_119);
  this->started_ = true;
  Logger::Logger(&local_10f8,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Raven65[P]WebServer/WebServer.cpp"
                 ,0x51);
  pLVar2 = Logger::stream(&local_10f8);
  pLVar2 = LogStream::operator<<(pLVar2,"WebServer started on port ");
  LogStream::operator<<(pLVar2,this->port_);
  Logger::~Logger(&local_10f8);
  return;
}

Assistant:

void WebServer::start() {
    reactorPool_->start();
    connPool_.start();
    ignoreSigpipe();    
    acceptChannel_->setReadCallback(std::bind(&WebServer::connectionCallback, this));
    acceptChannel_->setEvent(EPOLLIN | EPOLLET);
    loop_->addChannel(acceptChannel_);
    cachePage("/index.html");
    cachePage("/404.html");
    cachePage("/400.html");
    cachePage("/403.html");
    started_ = true;
    LOG << "WebServer started on port " <<port_;
}